

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

long get_cost(obj *obj,monst *shkp)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  schar sVar5;
  boolean bVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  
  lVar8 = getprice(obj,'\0');
  lVar12 = 5;
  if (lVar8 != 0) {
    lVar12 = lVar8;
  }
  if (((obj->field_0x4a & 0x20) != 0) && ((objects[obj->otyp].field_0x10 & 1) != 0))
  goto LAB_0023cebe;
  if ((obj->oclass != '\r') ||
     (uVar1 = obj->otyp, (*(ushort *)&objects[(short)uVar1].field_0x11 & 0x1f0) != 0x130)) {
    if ((obj->o_id & 3) == 0) {
      auVar2._8_8_ = 1;
      auVar2._0_8_ = 0x5555555555555556;
      lVar12 = SUB168(SEXT816(lVar12) * auVar2,8) - (lVar12 >> 0x3f);
    }
    goto LAB_0023cebe;
  }
  iVar10 = (int)u.ubirthday % (int)(short)uVar1;
  if (8 < uVar1 - 0x206) {
    warning("bad glass gem %d?");
    uVar11 = 0;
    goto LAB_0023ceb0;
  }
  iVar7 = (int)(short)uVar1 - ((int)(short)uVar1 >> 0x1f) >> 1;
  switch((uint)uVar1) {
  case 0x206:
    bVar13 = iVar10 - iVar7 < 0;
    uVar9 = 0x1fd;
    uVar11 = 0x1f1;
    break;
  case 0x207:
    uVar11 = (ulong)(iVar10 < iVar7) * 5 + 500;
    goto LAB_0023ceb0;
  case 0x208:
    bVar13 = iVar10 - iVar7 < 0;
    uVar9 = 0x201;
    uVar11 = 0x1f2;
    break;
  case 0x209:
    uVar11 = (ulong)(iVar10 < iVar7) | 0x1fa;
    goto LAB_0023ceb0;
  case 0x20a:
    bVar13 = iVar10 - iVar7 < 0;
    uVar9 = 0x204;
    uVar11 = 499;
    break;
  case 0x20b:
    bVar13 = iVar10 - iVar7 < 0;
    uVar9 = 0x1fe;
    uVar11 = 0x1f8;
    break;
  case 0x20c:
    bVar13 = iVar10 - iVar7 < 0;
    uVar9 = 0x1fc;
    uVar11 = 0x1f5;
    break;
  case 0x20d:
    bVar13 = iVar10 - iVar7 < 0;
    uVar9 = 0x205;
    uVar11 = 0x1f6;
    break;
  case 0x20e:
    uVar11 = (ulong)(iVar10 < iVar7) * 2 + 0x200;
    goto LAB_0023ceb0;
  }
  if (SBORROW4(iVar10,iVar7) != bVar13) {
    uVar11 = uVar9;
  }
LAB_0023ceb0:
  lVar12 = (long)objects[uVar11].oc_cost;
LAB_0023cebe:
  if ((((urole.malenum == 0x166) && (u.ulevel < 0xf)) ||
      ((uarmu != (obj *)0x0 && ((uarm == (obj *)0x0 && (uarmc == (obj *)0x0)))))) ||
     ((uarmh != (obj *)0x0 && (uarmh->otyp == 0x4d)))) {
    auVar3._8_8_ = 1;
    auVar3._0_8_ = 0x5555555555555556;
    lVar12 = SUB168(SEXT816(lVar12) * auVar3,8) - (lVar12 >> 0x3f);
  }
  sVar5 = acurr(5);
  if (sVar5 < '\x13') {
    sVar5 = acurr(5);
    if (sVar5 < '\x12') {
      sVar5 = acurr(5);
      if (sVar5 < '\x10') {
        sVar5 = acurr(5);
        if (sVar5 < '\x06') {
          lVar12 = lVar12 * 2;
        }
        else {
          sVar5 = acurr(5);
          if (sVar5 < '\b') {
            lVar12 = lVar12 + lVar12 / 2;
          }
          else {
            sVar5 = acurr(5);
            if (sVar5 < '\v') {
              auVar4._8_8_ = 1;
              auVar4._0_8_ = 0x5555555555555556;
              lVar12 = SUB168(SEXT816(lVar12) * auVar4,8) - (lVar12 >> 0x3f);
            }
          }
        }
      }
      else {
        lVar8 = lVar12 + 3;
        if (-1 < lVar12) {
          lVar8 = lVar12;
        }
        lVar12 = lVar12 - (lVar8 >> 2);
      }
    }
    else {
      lVar8 = SUB168(SEXT816(lVar12) * SEXT816(0x5555555555555555),8) - lVar12;
      lVar12 = lVar12 + ((lVar8 >> 1) - (lVar8 >> 0x3f));
    }
  }
  else {
    lVar12 = lVar12 / 2;
  }
  if (lVar12 < 1) {
    lVar8 = 1;
  }
  else {
    lVar8 = lVar12 * 4;
    if (obj->oartifact == '\0') {
      lVar8 = lVar12;
    }
  }
  if ((shkp != (monst *)0x0) && (*(char *)((long)&shkp[0x1b].meating + 2) != '\0')) {
    lVar8 = lVar8 + (lVar8 + 2U) / 3;
  }
  bVar6 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
  if (bVar6 != '\0') {
    if (((((byte)obj->oclass < 0xc) && ((0xf30U >> ((byte)obj->oclass & 0x1f) & 1) != 0)) ||
        ((ushort)(obj->otyp - 0x20fU) < 2)) || ((objects[obj->otyp].field_0x10 & 0x10) != 0)) {
      lVar8 = lVar8 * 0x32;
    }
    else {
      lVar8 = lVar8 * 0x19;
    }
  }
  return lVar8;
}

Assistant:

static long get_cost(const struct obj *obj,
		     struct monst *shkp) /* if angry, impose a surcharge */
{
	long tmp = getprice(obj, FALSE);

	if (!tmp) tmp = 5L;
	/* shopkeeper may notice if the player isn't very knowledgeable -
	   especially when gem prices are concerned */
	if (!obj->dknown || !objects[obj->otyp].oc_name_known) {
		if (obj->oclass == GEM_CLASS &&
			objects[obj->otyp].oc_material == GLASS) {
		    int i;
		    /* get a value that's 'random' from game to game, but the
		       same within the same game */
		    boolean pseudorand =
			(((int)u.ubirthday % obj->otyp) >= obj->otyp/2);

		    /* all gems are priced high - real or not */
		    switch(obj->otyp - LAST_GEM) {
			case 1: /* white */
			    i = pseudorand ? DIAMOND : OPAL;
			    break;
			case 2: /* blue */
			    i = pseudorand ? SAPPHIRE : AQUAMARINE;
			    break;
			case 3: /* red */
			    i = pseudorand ? RUBY : JASPER;
			    break;
			case 4: /* yellowish brown */
			    i = pseudorand ? AMBER : TOPAZ;
			    break;
			case 5: /* orange */
			    i = pseudorand ? JACINTH : AGATE;
			    break;
			case 6: /* yellow */
			    i = pseudorand ? CITRINE : CHRYSOBERYL;
			    break;
			case 7: /* black */
			    i = pseudorand ? BLACK_OPAL : JET;
			    break;
			case 8: /* green */
			    i = pseudorand ? EMERALD : JADE;
			    break;
			case 9: /* violet */
			    i = pseudorand ? AMETHYST : FLUORITE;
			    break;
			default: warning("bad glass gem %d?", obj->otyp);
			    i = STRANGE_OBJECT;
			    break;
		    }
		    tmp = (long) objects[i].oc_cost;
		} else if (!(obj->o_id % 4)) /* arbitrarily impose surcharge */
		    tmp += tmp / 3L;
	}
	if ((Role_if (PM_TOURIST) && u.ulevel < (MAXULEV/2))
	    || (uarmu && !uarm && !uarmc))	/* touristy shirt visible */
		tmp += tmp / 3L;
	else if (uarmh && uarmh->otyp == DUNCE_CAP)
		tmp += tmp / 3L;

	if (ACURR(A_CHA) > 18)		tmp /= 2L;
	else if (ACURR(A_CHA) > 17)	tmp -= tmp / 3L;
	else if (ACURR(A_CHA) > 15)	tmp -= tmp / 4L;
	else if (ACURR(A_CHA) < 6)	tmp *= 2L;
	else if (ACURR(A_CHA) < 8)	tmp += tmp / 2L;
	else if (ACURR(A_CHA) < 11)	tmp += tmp / 3L;
	if (tmp <= 0L) tmp = 1L;
	else if (obj->oartifact) tmp *= 4L;
	/* anger surcharge should match rile_shk's */
	if (shkp && ESHK(shkp)->surcharge) tmp += (tmp + 2L) / 3L;

	/* Big mark-up for Black Market items. */
	if (Is_blackmarket(&u.uz)) {
	    if (obj->oclass==RING_CLASS    || obj->oclass==AMULET_CLASS   ||
		obj->oclass==POTION_CLASS  || obj->oclass==SCROLL_CLASS   ||
		obj->oclass==SPBOOK_CLASS  || obj->oclass==WAND_CLASS     ||
		obj->otyp==LUCKSTONE       || obj->otyp==LOADSTONE        ||
		objects[obj->otyp].oc_magic) {
		tmp *= 50;
	    } else {
		tmp *= 25;
	    }
	}

	return tmp;
}